

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::PrimSpec::PrimSpec(PrimSpec *this,PrimSpec *rhs)

{
  _Rb_tree_header *p_Var1;
  
  this->_specifier = Def;
  (this->_typeName)._M_dataplus._M_p = (pointer)&(this->_typeName).field_2;
  (this->_typeName)._M_string_length = 0;
  (this->_typeName).field_2._M_local_buf[0] = '\0';
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_props)._M_t._M_impl.super__Rb_tree_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_props)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_current_vsmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_variantSets)._M_t._M_impl.super__Rb_tree_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variantChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_properties).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_primChildren).super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  PrimMetas::PrimMetas(&this->_metas);
  (this->_current_working_path)._M_dataplus._M_p = (pointer)&(this->_current_working_path).field_2;
  (this->_current_working_path)._M_string_length = 0;
  (this->_current_working_path).field_2._M_local_buf[0] = '\0';
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_asset_search_paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this != rhs) {
    CopyFrom(this,rhs);
    return;
  }
  return;
}

Assistant:

PrimSpec(const PrimSpec &rhs) {
    if (this != &rhs) {
      CopyFrom(rhs);
    }
  }